

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O0

EulerAngles * __thiscall
KDIS::DATA_TYPE::EulerAngles::operator*
          (EulerAngles *__return_storage_ptr__,EulerAngles *this,KFLOAT64 Value)

{
  KFLOAT64 Value_local;
  EulerAngles *this_local;
  EulerAngles *tmp;
  
  EulerAngles(__return_storage_ptr__,this);
  __return_storage_ptr__->m_f32Psi =
       (KFLOAT32)(float)((double)(float)__return_storage_ptr__->m_f32Psi * (double)Value);
  __return_storage_ptr__->m_f32Theta =
       (KFLOAT32)(float)((double)(float)__return_storage_ptr__->m_f32Theta * (double)Value);
  __return_storage_ptr__->m_f32Phi =
       (KFLOAT32)(float)((double)(float)__return_storage_ptr__->m_f32Phi * (double)Value);
  return __return_storage_ptr__;
}

Assistant:

EulerAngles KDIS::DATA_TYPE::EulerAngles::operator * ( KFLOAT64 Value ) const
{
    EulerAngles tmp = *this;
    tmp.m_f32Psi   *= Value;
    tmp.m_f32Theta *= Value;
    tmp.m_f32Phi   *= Value;
    return tmp;
}